

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::NoteNewRevision(cmCTestGIT *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  char *msg;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream cmCTestLog_msg;
  string local_30;
  cmCTestGIT *local_10;
  cmCTestGIT *this_local;
  
  local_10 = this;
  GetWorkingRevision_abi_cxx11_(&local_30,this);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmCTestGlobalVC).NewRevision,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,"   New revision of repository is: ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_cmCTestGlobalVC).NewRevision);
  std::operator<<(poVar1,"\n");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestGIT.cxx"
               ,0x57,msg,false);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return true;
}

Assistant:

bool cmCTestGIT::NoteNewRevision()
{
  this->NewRevision = this->GetWorkingRevision();
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   New revision of repository is: " << this->NewRevision
                                                  << "\n");
  return true;
}